

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLCONCEALBABYSWALL_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000388;
  double *in_stack_00000390;
  double *in_stack_00000398;
  double *in_stack_000003a0;
  int in_stack_000003ac;
  int in_stack_000003b0;
  int *in_stack_000003c0;
  int *in_stack_000003c8;
  int *in_stack_000003d0;
  
  TVar1 = TA_CDLCONCEALBABYSWALL
                    (in_stack_000003b0,in_stack_000003ac,in_stack_000003a0,in_stack_00000398,
                     in_stack_00000390,in_stack_00000388,in_stack_000003c0,in_stack_000003c8,
                     in_stack_000003d0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLCONCEALBABYSWALL_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLCONCEALBABYSWALL(
/* Generated */                             startIdx,
/* Generated */                             endIdx,
/* Generated */                             params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                             params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                             params->in[0].data.inPrice.low, /* inLow */
/* Generated */                             params->in[0].data.inPrice.close, /* inClose */
/* Generated */                             outBegIdx, 
/* Generated */                             outNBElement, 
/* Generated */                             params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }